

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O3

void __thiscall Kvm::printCell(Kvm *this,Value *v,ostream *out)

{
  Value *pVVar1;
  long lVar2;
  ValueType *pVVar3;
  
  print(this,(Value *)v[1]._vptr_Value,out);
  pVVar3 = &v[1].type_;
  pVVar1 = *(Value **)&v[1].type_;
  while ((((ulong)pVVar1 & 3) == 0 && (pVVar1->type_ == CELL))) {
    std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
    lVar2 = *(long *)pVVar3;
    print(this,*(Value **)(lVar2 + 0x18),out);
    pVVar3 = (ValueType *)(lVar2 + 0x20);
    pVVar1 = *(Value **)(lVar2 + 0x20);
  }
  if (pVVar1 != this->NIL) {
    std::__ostream_insert<char,std::char_traits<char>>(out," . ",3);
    print(this,*(Value **)pVVar3,out);
    return;
  }
  return;
}

Assistant:

void Kvm::printCell(const Value *v, std::ostream &out)
{
    print(car(v), out);
    if (isCell(cdr(v)))
    {
        out << " ";
        printCell(cdr(v), out);
    } else if (cdr(v) != NIL)
    {
        out << " . ";
        print(cdr(v), out);
    }
}